

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O0

void __thiscall RTLsTy::RegisterLib(RTLsTy *this,__tgt_bin_desc *desc)

{
  bool bVar1;
  int32_t iVar2;
  reference pvVar3;
  reference ppRVar4;
  size_type sVar5;
  mapped_type *img_00;
  int *in_RSI;
  TranslationTable *TransTable;
  TranslationTable *tt;
  int32_t device_id;
  size_t start;
  DeviceTy device;
  RTLInfoTy *R;
  iterator __end2;
  iterator __begin2;
  list<RTLInfoTy,_std::allocator<RTLInfoTy>_> *__range2;
  RTLInfoTy *FoundRTL;
  __tgt_device_image *img;
  int32_t i;
  int32_t in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  DevicesTy *in_stack_fffffffffffffe48;
  RTLInfoTy *in_stack_fffffffffffffe50;
  value_type *in_stack_fffffffffffffe60;
  reference in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe70;
  int iVar6;
  undefined4 in_stack_fffffffffffffe74;
  RTLInfoTy *in_stack_fffffffffffffe78;
  DeviceTy *in_stack_fffffffffffffe80;
  RTLInfoTy local_178;
  reference local_60;
  _Self local_58;
  _Self local_50;
  undefined8 local_48;
  reference local_40;
  void *local_38;
  int local_2c;
  code *local_20;
  undefined8 local_18;
  int *local_10;
  
  local_20 = LoadRTLs;
  local_18 = 0;
  local_10 = in_RSI;
  std::call_once<void(RTLsTy::*)(),RTLsTy*>
            ((once_flag *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (offset_in_RTLsTy_to_subr *)in_stack_fffffffffffffe68,
             (RTLsTy **)in_stack_fffffffffffffe60);
  std::mutex::lock((mutex *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  local_2c = 0;
  do {
    if (*local_10 <= local_2c) {
      std::mutex::unlock((mutex *)0x106653);
      return;
    }
    local_38 = (void *)(*(long *)(local_10 + 2) + (long)local_2c * 0x20);
    local_40 = (reference)0x0;
    local_48 = 0x125220;
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::list<RTLInfoTy,_std::allocator<RTLInfoTy>_>::begin
                   ((list<RTLInfoTy,_std::allocator<RTLInfoTy>_> *)
                    CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    local_58._M_node =
         (_List_node_base *)
         std::__cxx11::list<RTLInfoTy,_std::allocator<RTLInfoTy>_>::end
                   ((list<RTLInfoTy,_std::allocator<RTLInfoTy>_> *)
                    CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    while( true ) {
      bVar1 = std::operator!=(&local_50,&local_58);
      if (!bVar1) goto LAB_00106622;
      local_60 = std::_List_iterator<RTLInfoTy>::operator*((_List_iterator<RTLInfoTy> *)0x106365);
      iVar2 = (*local_60->is_valid_binary)(local_38);
      if (iVar2 != 0) break;
      std::_List_iterator<RTLInfoTy>::operator++(&local_50);
    }
    if ((local_60->isUsed & 1U) == 0) {
      in_stack_fffffffffffffe50 = &local_178;
      DeviceTy::DeviceTy(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe48 = &Devices;
      in_stack_fffffffffffffe80 =
           (DeviceTy *)std::vector<DeviceTy,_std::allocator<DeviceTy>_>::size(&Devices);
      std::vector<DeviceTy,_std::allocator<DeviceTy>_>::resize
                ((vector<DeviceTy,_std::allocator<DeviceTy>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 (size_type)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      in_stack_fffffffffffffe70 = 0;
      while (in_stack_fffffffffffffe70 < local_60->NumberOfDevices) {
        in_stack_fffffffffffffe40 = (int)in_stack_fffffffffffffe80 + in_stack_fffffffffffffe70;
        in_stack_fffffffffffffe44 = in_stack_fffffffffffffe70;
        pvVar3 = std::vector<DeviceTy,_std::allocator<DeviceTy>_>::operator[]
                           (&Devices,(long)&in_stack_fffffffffffffe80->DeviceID +
                                     (long)in_stack_fffffffffffffe70);
        pvVar3->DeviceID = in_stack_fffffffffffffe40;
        iVar6 = in_stack_fffffffffffffe44;
        pvVar3 = std::vector<DeviceTy,_std::allocator<DeviceTy>_>::operator[]
                           (&Devices,(long)&in_stack_fffffffffffffe80->DeviceID +
                                     (long)in_stack_fffffffffffffe44);
        pvVar3->RTLDeviceID = in_stack_fffffffffffffe44;
        in_stack_fffffffffffffe70 = iVar6 + 1;
      }
      bVar1 = std::vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>::empty
                        ((vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_> *)
                         in_stack_fffffffffffffe50);
      if (bVar1) {
        in_stack_fffffffffffffe3c = 0;
      }
      else {
        ppRVar4 = std::vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>::back
                            ((vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_> *)
                             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        in_stack_fffffffffffffe38 = (*ppRVar4)->Idx;
        ppRVar4 = std::vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>::back
                            ((vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_> *)
                             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        in_stack_fffffffffffffe3c = in_stack_fffffffffffffe38 + (*ppRVar4)->NumberOfDevices;
      }
      local_60->Idx = in_stack_fffffffffffffe3c;
      local_60->isUsed = true;
      in_stack_fffffffffffffe68 = local_60;
      std::vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>::push_back
                ((vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_> *)
                 CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 (value_type *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      DeviceTy::~DeviceTy((DeviceTy *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40))
      ;
    }
    std::mutex::lock((mutex *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    sVar5 = std::
            map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
            ::count((map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
                     *)in_stack_fffffffffffffe50,(key_type *)in_stack_fffffffffffffe48);
    if (sVar5 == 0) {
      in_stack_fffffffffffffe60 =
           (value_type *)
           std::
           map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
           ::operator[]((map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
                         *)in_stack_fffffffffffffe80,(key_type *)in_stack_fffffffffffffe78);
      iVar6 = local_10[5];
      in_stack_fffffffffffffe60->DeviceID = local_10[4];
      *(int *)&in_stack_fffffffffffffe60->field_0x4 = iVar6;
      in_stack_fffffffffffffe60->RTL = *(RTLInfoTy **)(local_10 + 6);
    }
    img_00 = std::
             map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
             ::operator[]((map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
                           *)in_stack_fffffffffffffe80,(key_type *)in_stack_fffffffffffffe78);
    RegisterImageIntoTranslationTable
              ((TranslationTable *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68,(__tgt_device_image *)in_stack_fffffffffffffe60);
    std::mutex::unlock((mutex *)0x1065e1);
    local_40 = local_60;
    RegisterGlobalCtorsDtorsForImage
              ((__tgt_bin_desc *)in_stack_fffffffffffffe60,(__tgt_device_image *)img_00,
               in_stack_fffffffffffffe50);
LAB_00106622:
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

void RTLsTy::RegisterLib(__tgt_bin_desc *desc) {
  // Attempt to load all plugins available in the system.
  std::call_once(initFlag, &RTLsTy::LoadRTLs, this);

  RTLsMtx.lock();
  // Register the images with the RTLs that understand them, if any.
  for (int32_t i = 0; i < desc->NumDeviceImages; ++i) {
    // Obtain the image.
    __tgt_device_image *img = &desc->DeviceImages[i];

    RTLInfoTy *FoundRTL = NULL;

    // Scan the RTLs that have associated images until we find one that supports
    // the current image.
    for (auto &R : RTLs.AllRTLs) {
      if (!R.is_valid_binary(img)) {
        DP("Image " DPxMOD " is NOT compatible with RTL %s!\n",
            DPxPTR(img->ImageStart), R.RTLName.c_str());
        continue;
      }

      DP("Image " DPxMOD " is compatible with RTL %s!\n",
          DPxPTR(img->ImageStart), R.RTLName.c_str());

      // If this RTL is not already in use, initialize it.
      if (!R.isUsed) {
        // Initialize the device information for the RTL we are about to use.
        DeviceTy device(&R);
        size_t start = Devices.size();
        Devices.resize(start + R.NumberOfDevices, device);
        for (int32_t device_id = 0; device_id < R.NumberOfDevices;
            device_id++) {
          // global device ID
          Devices[start + device_id].DeviceID = start + device_id;
          // RTL local device ID
          Devices[start + device_id].RTLDeviceID = device_id;
        }

        // Initialize the index of this RTL and save it in the used RTLs.
        R.Idx = (RTLs.UsedRTLs.empty())
                    ? 0
                    : RTLs.UsedRTLs.back()->Idx +
                          RTLs.UsedRTLs.back()->NumberOfDevices;
        assert((size_t) R.Idx == start &&
            "RTL index should equal the number of devices used so far.");
        R.isUsed = true;
        RTLs.UsedRTLs.push_back(&R);

        DP("RTL " DPxMOD " has index %d!\n", DPxPTR(R.LibraryHandler), R.Idx);
      }

      // Initialize (if necessary) translation table for this library.
      TrlTblMtx.lock();
      if(!HostEntriesBeginToTransTable.count(desc->HostEntriesBegin)){
        TranslationTable &tt =
            HostEntriesBeginToTransTable[desc->HostEntriesBegin];
        tt.HostTable.EntriesBegin = desc->HostEntriesBegin;
        tt.HostTable.EntriesEnd = desc->HostEntriesEnd;
      }

      // Retrieve translation table for this library.
      TranslationTable &TransTable =
          HostEntriesBeginToTransTable[desc->HostEntriesBegin];

      DP("Registering image " DPxMOD " with RTL %s!\n",
          DPxPTR(img->ImageStart), R.RTLName.c_str());
      RegisterImageIntoTranslationTable(TransTable, R, img);
      TrlTblMtx.unlock();
      FoundRTL = &R;

      // Load ctors/dtors for static objects
      RegisterGlobalCtorsDtorsForImage(desc, img, FoundRTL);

      // if an RTL was found we are done - proceed to register the next image
      break;
    }

    if (!FoundRTL) {
      DP("No RTL found for image " DPxMOD "!\n", DPxPTR(img->ImageStart));
    }
  }
  RTLsMtx.unlock();


  DP("Done registering entries!\n");
}